

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_formatter-inl.h
# Opt level: O0

populator_set * spdlog::json_formatter::make_default_populators_(void)

{
  populator_set *in_RDI;
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  *in_stack_000000d0;
  unique_ptr<spdlog::populators::logger_name_populator,_std::default_delete<spdlog::populators::logger_name_populator>_>
  *in_stack_000000d8;
  unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  *in_stack_000000e0;
  unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  *in_stack_000000e8;
  
  details::make_unique<spdlog::populators::date_time_populator>();
  details::make_unique<spdlog::populators::level_populator>();
  details::make_unique<spdlog::populators::logger_name_populator>();
  details::make_unique<spdlog::populators::message_populator>();
  populators::
  make_populator_set<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::logger_name_populator,std::default_delete<spdlog::populators::logger_name_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
            (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  std::
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
                 *)in_RDI);
  std::
  unique_ptr<spdlog::populators::logger_name_populator,_std::default_delete<spdlog::populators::logger_name_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::logger_name_populator,_std::default_delete<spdlog::populators::logger_name_populator>_>
                 *)in_RDI);
  std::
  unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                 *)in_RDI);
  std::
  unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
                 *)in_RDI);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE populators::populator_set json_formatter::make_default_populators_()
{
    return populators::make_populator_set(
        details::make_unique<populators::date_time_populator>(),
        details::make_unique<populators::level_populator>(),
        details::make_unique<populators::logger_name_populator>(),
        details::make_unique<populators::message_populator>());
}